

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_pHYs(ucvector *out,LodePNGInfo *info)

{
  ulong uVar1;
  uint uVar2;
  uint extraout_EAX;
  uchar *puVar3;
  ulong __size;
  uchar *data;
  size_t sVar4;
  ucvector local_48;
  
  local_48.data = (uchar *)0x0;
  local_48.size = 0;
  local_48.allocsize = 0;
  lodepng_add32bitInt(&local_48,info->phys_x);
  lodepng_add32bitInt(&local_48,info->phys_y);
  sVar4 = local_48.size;
  data = local_48.data;
  uVar2 = info->phys_unit;
  uVar1 = local_48.size + 1;
  puVar3 = local_48.data;
  if (local_48.allocsize < uVar1) {
    __size = uVar1 * 3 >> 1;
    if (local_48.allocsize * 2 < uVar1) {
      __size = uVar1;
    }
    puVar3 = (uchar *)realloc(local_48.data,__size);
    if (puVar3 == (uchar *)0x0) goto LAB_0010ca12;
  }
  puVar3[sVar4] = (uchar)uVar2;
  data = puVar3;
  sVar4 = uVar1;
LAB_0010ca12:
  uVar2 = lodepng_chunk_create(&out->data,&out->size,(uint)sVar4,"pHYs",data);
  if (uVar2 == 0) {
    out->allocsize = out->size;
  }
  free(data);
  return extraout_EAX;
}

Assistant:

static unsigned addChunk_pHYs(ucvector* out, const LodePNGInfo* info)
{
  unsigned error = 0;
  ucvector data;
  ucvector_init(&data);

  lodepng_add32bitInt(&data, info->phys_x);
  lodepng_add32bitInt(&data, info->phys_y);
  ucvector_push_back(&data, info->phys_unit);

  error = addChunk(out, "pHYs", data.data, data.size);
  ucvector_cleanup(&data);

  return error;
}